

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

void lua_pushnumber(lua_State *L,lua_Number n)

{
  int iVar1;
  StkId pTVar2;
  int *piVar3;
  
  iVar1 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar1 + 1;
  if (iVar1 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,500,"void lua_pushnumber(lua_State *, lua_Number)");
  }
  pTVar2 = L->top;
  (pTVar2->value_).n = n;
  pTVar2->tt_ = 3;
  pTVar2 = L->top;
  L->top = pTVar2 + 1;
  if (pTVar2 + 1 <= L->ci->top) {
    piVar3 = *(int **)&L[-1].hookmask;
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      return;
    }
    __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x1f7,"void lua_pushnumber(lua_State *, lua_Number)");
  }
  __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x1f6,"void lua_pushnumber(lua_State *, lua_Number)");
}

Assistant:

LUA_API void lua_pushnumber (lua_State *L, lua_Number n) {
  lua_lock(L);
  setfltvalue(L->top, n);
  api_incr_top(L);
  lua_unlock(L);
}